

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

void __thiscall InlineeFrameRecord::Dump(InlineeFrameRecord *this)

{
  BOOLEAN BVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  char16 *pcVar4;
  uint local_14;
  uint i;
  InlineeFrameRecord *this_local;
  
  pcVar4 = Js::ParseableFunctionInfo::GetExternalDisplayName
                     (&this->functionBody->super_ParseableFunctionInfo);
  uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->functionBody);
  LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->functionBody);
  Output::Print(L"%s [#%u.%u] args:",pcVar4,(ulong)uVar2,(ulong)LVar3);
  for (local_14 = 0; local_14 < this->argCount; local_14 = local_14 + 1) {
    DumpOffset(this,this->argOffsets[local_14]);
    BVar1 = BVUnitT<unsigned_long>::Test(&this->floatArgs,local_14);
    if (BVar1 == '\0') {
      BVar1 = BVUnitT<unsigned_long>::Test(&this->losslessInt32Args,local_14);
      if (BVar1 != '\0') {
        Output::Print(L"i ");
      }
    }
    else {
      Output::Print(L"f ");
    }
    Output::Print(L", ");
  }
  InlineeFrameInfo::Dump(this->frameInfo);
  Output::Print(L"func: ");
  DumpOffset(this,this->functionOffset);
  if (this->parent != (InlineeFrameRecord *)0x0) {
    Dump(this->parent);
  }
  return;
}

Assistant:

void InlineeFrameRecord::Dump() const
{
    Output::Print(_u("%s [#%u.%u] args:"), this->functionBody->GetExternalDisplayName(), this->functionBody->GetSourceContextId(), this->functionBody->GetLocalFunctionId());
    for (uint i = 0; i < argCount; i++)
    {
        DumpOffset(argOffsets[i]);
        if (floatArgs.Test(i))
        {
            Output::Print(_u("f "));
        }
        else if (losslessInt32Args.Test(i))
        {
            Output::Print(_u("i "));
        }
        Output::Print(_u(", "));
    }
    this->frameInfo->Dump();

    Output::Print(_u("func: "));
    DumpOffset(functionOffset);

    if (this->parent)
    {
        parent->Dump();
    }
}